

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

_Bool override_from_base(ecs_world_t *world,ecs_entity_t base,ecs_entity_t component,
                        ecs_data_t *data,ecs_column_t *column,int32_t row,int32_t count)

{
  short sVar1;
  int16_t offset;
  ecs_entity_t eVar2;
  _Bool _Var3;
  void *__src;
  void *pvVar4;
  ecs_entity_t component_00;
  ecs_c_info_t *peVar5;
  void *pvVar6;
  size_t sVar7;
  long lVar8;
  ecs_copy_t local_d0;
  ecs_type_t base_type;
  void *ctx;
  ecs_entity_t *entities;
  ecs_copy_t copy;
  int32_t index;
  ecs_c_info_t *cdata;
  void *data_ptr;
  void *data_array;
  int16_t data_size;
  void *base_ptr;
  ecs_entity_info_t base_info;
  int32_t row_local;
  ecs_column_t *column_local;
  ecs_data_t *data_local;
  ecs_entity_t component_local;
  ecs_entity_t base_local;
  ecs_world_t *world_local;
  
  base_info._28_4_ = row;
  component_local = base;
  base_local = (ecs_entity_t)world;
  _ecs_assert(component != 0,0xc,(char *)0x0,"component != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x269);
  if (component != 0) {
    _Var3 = ecs_get_info((ecs_world_t *)base_local,component_local,(ecs_entity_info_t *)&base_ptr);
    if ((_Var3) && (base_info.record != (ecs_record_t *)0x0)) {
      __src = get_component((ecs_entity_info_t *)&base_ptr,component);
      if (__src == (void *)0x0) {
        world_local._7_1_ =
             override_component((ecs_world_t *)base_local,component,
                                (ecs_type_t)(base_info.record)->table,data,column,base_info._28_4_,
                                count);
      }
      else {
        sVar1 = column->size;
        if (column->alignment < 0x10) {
          offset = 0x10;
        }
        else {
          offset = column->alignment;
        }
        pvVar4 = _ecs_vector_first(column->data,(int)column->size,offset);
        cdata = (ecs_c_info_t *)((long)pvVar4 + (long)((int)sVar1 * base_info._28_4_));
        component_00 = ecs_get_typeid((ecs_world_t *)base_local,component);
        peVar5 = ecs_get_c_info((ecs_world_t *)base_local,component_00);
        if (peVar5 == (ecs_c_info_t *)0x0) {
          local_d0 = (ecs_copy_t)0x0;
        }
        else {
          local_d0 = (peVar5->lifecycle).copy;
        }
        if (local_d0 == (ecs_copy_t)0x0) {
          for (copy._4_4_ = 0; copy._4_4_ < count; copy._4_4_ = copy._4_4_ + 1) {
            memcpy(cdata,__src,(long)sVar1);
            cdata = (ecs_c_info_t *)((long)&cdata->component + (long)sVar1);
          }
        }
        else {
          pvVar6 = _ecs_vector_first(data->entities,8,0x10);
          pvVar4 = (peVar5->lifecycle).ctx;
          for (copy._4_4_ = 0; eVar2 = base_local, copy._4_4_ < count; copy._4_4_ = copy._4_4_ + 1)
          {
            lVar8 = (long)(int)base_info._28_4_;
            sVar7 = ecs_to_size_t((long)sVar1);
            (*local_d0)((ecs_world_t *)eVar2,component_00,(ecs_entity_t *)((long)pvVar6 + lVar8 * 8)
                        ,&component_local,cdata,__src,sVar7,1,pvVar4);
            cdata = (ecs_c_info_t *)((long)&cdata->component + (long)sVar1);
          }
        }
        world_local._7_1_ = true;
      }
    }
    else {
      world_local._7_1_ = false;
    }
    return world_local._7_1_;
  }
  __assert_fail("component != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x269,
                "_Bool override_from_base(ecs_world_t *, ecs_entity_t, ecs_entity_t, ecs_data_t *, ecs_column_t *, int32_t, int32_t)"
               );
}

Assistant:

static
bool override_from_base(
    ecs_world_t * world,
    ecs_entity_t base,
    ecs_entity_t component,
    ecs_data_t * data,
    ecs_column_t * column,
    int32_t row,
    int32_t count)
{
    ecs_entity_info_t base_info;
    ecs_assert(component != 0, ECS_INTERNAL_ERROR, NULL);

    if (!ecs_get_info(world, base, &base_info) || !base_info.table) {
        return false;
    }

    void *base_ptr = get_component(&base_info, component);
    if (base_ptr) {
        int16_t data_size = column->size;
        void *data_array = ecs_vector_first_t(
            column->data, column->size, column->alignment);
        void *data_ptr = ECS_OFFSET(data_array, data_size * row);

        component = ecs_get_typeid(world, component);
        ecs_c_info_t *cdata = ecs_get_c_info(world, component);
        int32_t index;

        ecs_copy_t copy = cdata ? cdata->lifecycle.copy : NULL;
        if (copy) {
            ecs_entity_t *entities = ecs_vector_first(
                data->entities, ecs_entity_t);

            void *ctx = cdata->lifecycle.ctx;
            for (index = 0; index < count; index ++) {
                copy(world, component, &entities[row], &base,
                    data_ptr, base_ptr, ecs_to_size_t(data_size), 1, ctx);
                data_ptr = ECS_OFFSET(data_ptr, data_size);
            }
        } else {
            for (index = 0; index < count; index ++) {
                ecs_os_memcpy(data_ptr, base_ptr, data_size);
                data_ptr = ECS_OFFSET(data_ptr, data_size);
            }                    
        }

        return true;
    } else {
        /* If component not found on base, check if base itself inherits */
        ecs_type_t base_type = base_info.table->type;
        return override_component(world, component, base_type, data, column, 
            row, count);
    }
}